

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

error_code __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
set_option_linger(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this
                 ,bool b,uint16_t timeout,error_code *ec)

{
  undefined6 in_register_00000012;
  undefined7 in_register_00000031;
  error_code eVar1;
  linger<1,_13> local_10;
  
  local_10.value_.l_onoff = (int)CONCAT71(in_register_00000031,b);
  local_10.value_.l_linger = (int)CONCAT62(in_register_00000012,timeout);
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  set_option<asio::detail::socket_option::linger<1,13>>
            ((this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_
             ,&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
               implementation_,&local_10,ec);
  eVar1._4_4_ = 0;
  eVar1._M_value = ec->_M_value;
  eVar1._M_cat = ec->_M_cat;
  return eVar1;
}

Assistant:

std::error_code
        set_option_linger(bool b, uint16_t timeout, std::error_code& ec)
    {
        return set_option(asio::socket_base::linger(b, timeout), ec);
    }